

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2d.cpp
# Opt level: O0

void __thiscall Texture2D::set_custom_wrap(Texture2D *this,uint32_t wrap)

{
  socklen_t in_ECX;
  sockaddr *in_RDX;
  uint32_t wrap_local;
  Texture2D *this_local;
  
  bind(this,wrap,in_RDX,in_ECX);
  (*glad_glTexParameteri)(0xde1,0x2802,wrap);
  (*glad_glTexParameteri)(0xde1,0x2803,wrap);
  return;
}

Assistant:

void Texture2D::set_custom_wrap(uint32_t wrap)
{
#if OPENGL_VERSION >= 45
    glTextureParameteri(m_id, GL_TEXTURE_WRAP_S, wrap);
    glTextureParameteri(m_id, GL_TEXTURE_WRAP_T, wrap);	
#else
    bind();
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, wrap);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, wrap);	
#endif
}